

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::Validator::operator()(string *__return_storage_ptr__,Validator *this,string *str)

{
  pointer pcVar1;
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->active_ == true) {
    if (this->non_modifying_ == true) {
      pcVar1 = (str->_M_dataplus)._M_p;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + str->_M_string_length);
      if ((this->func_).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*(this->func_)._M_invoker)(&local_40,(_Any_data *)&this->func_,&local_60);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return __return_storage_ptr__;
      }
    }
    else {
      if ((this->func_).super__Function_base._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*(this->func_)._M_invoker)(&local_60,(_Any_data *)&this->func_,str);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return __return_storage_ptr__;
      }
    }
    operator_delete(local_60._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(std::string &str) const {
        std::string retstring;
        if(active_) {
            if(non_modifying_) {
                std::string value = str;
                retstring = func_(value);
            } else {
                retstring = func_(str);
            }
        }
        return retstring;
    }